

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionAccept.cpp
# Opt level: O2

void __thiscall ki::protocol::control::SessionAccept::write_to(SessionAccept *this,ostream *ostream)

{
  Field<int> *pFVar1;
  Field<unsigned_int> *pFVar2;
  Field<unsigned_short> *pFVar3;
  allocator local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  Record record;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)&local_80,"unknown",&local_101);
  ki::dml::Record::add_field<unsigned_short>(&record,&local_80,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"unknown2",&local_101);
  ki::dml::Record::add_field<unsigned_int>(&record,&local_a0,true);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,"m_timestamp",&local_101);
  pFVar1 = ki::dml::Record::add_field<int>(&record,&local_c0,true);
  pFVar1->m_value = this->m_timestamp;
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_e0,"m_milliseconds",&local_101);
  pFVar2 = ki::dml::Record::add_field<unsigned_int>(&record,&local_e0,true);
  pFVar2->m_value = this->m_milliseconds;
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_100,"m_session_id",&local_101);
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(&record,&local_100,true);
  pFVar3->m_value = this->m_session_id;
  std::__cxx11::string::~string((string *)&local_100);
  ki::dml::Record::write_to(&record,ostream);
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void SessionAccept::write_to(std::ostream& ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("unknown");
		record.add_field<dml::UINT>("unknown2");
		record.add_field<dml::INT>("m_timestamp")->set_value(m_timestamp);
		record.add_field<dml::UINT>("m_milliseconds")->set_value(m_milliseconds);
		record.add_field<dml::USHRT>("m_session_id")->set_value(m_session_id);
		record.write_to(ostream);
	}